

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O0

void load_GL_HP_image_transform(GLADloadproc load)

{
  GLADloadproc load_local;
  
  if (GLAD_GL_HP_image_transform != 0) {
    glad_glImageTransformParameteriHP =
         (PFNGLIMAGETRANSFORMPARAMETERIHPPROC)(*load)("glImageTransformParameteriHP");
    glad_glImageTransformParameterfHP =
         (PFNGLIMAGETRANSFORMPARAMETERFHPPROC)(*load)("glImageTransformParameterfHP");
    glad_glImageTransformParameterivHP =
         (PFNGLIMAGETRANSFORMPARAMETERIVHPPROC)(*load)("glImageTransformParameterivHP");
    glad_glImageTransformParameterfvHP =
         (PFNGLIMAGETRANSFORMPARAMETERFVHPPROC)(*load)("glImageTransformParameterfvHP");
    glad_glGetImageTransformParameterivHP =
         (PFNGLGETIMAGETRANSFORMPARAMETERIVHPPROC)(*load)("glGetImageTransformParameterivHP");
    glad_glGetImageTransformParameterfvHP =
         (PFNGLGETIMAGETRANSFORMPARAMETERFVHPPROC)(*load)("glGetImageTransformParameterfvHP");
  }
  return;
}

Assistant:

static void load_GL_HP_image_transform(GLADloadproc load) {
	if(!GLAD_GL_HP_image_transform) return;
	glad_glImageTransformParameteriHP = (PFNGLIMAGETRANSFORMPARAMETERIHPPROC)load("glImageTransformParameteriHP");
	glad_glImageTransformParameterfHP = (PFNGLIMAGETRANSFORMPARAMETERFHPPROC)load("glImageTransformParameterfHP");
	glad_glImageTransformParameterivHP = (PFNGLIMAGETRANSFORMPARAMETERIVHPPROC)load("glImageTransformParameterivHP");
	glad_glImageTransformParameterfvHP = (PFNGLIMAGETRANSFORMPARAMETERFVHPPROC)load("glImageTransformParameterfvHP");
	glad_glGetImageTransformParameterivHP = (PFNGLGETIMAGETRANSFORMPARAMETERIVHPPROC)load("glGetImageTransformParameterivHP");
	glad_glGetImageTransformParameterfvHP = (PFNGLGETIMAGETRANSFORMPARAMETERFVHPPROC)load("glGetImageTransformParameterfvHP");
}